

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtIsOnGeodesic.cpp
# Opt level: O3

bool GeoCalcs::PtIsOnGeodesic
               (LLPoint *pt1,LLPoint *pt2,LLPoint *pt3,int lengthCode,PtIsOnGeodesicResult *result)

{
  double dVar1;
  bool bVar2;
  LLPoint LVar3;
  InverseResult invResult;
  InverseResult local_68;
  double local_50;
  double local_48;
  LLPoint local_40;
  
  local_68.azimuth = 0.0;
  local_68.reverseAzimuth = 0.0;
  local_68.distance = 0.0;
  bVar2 = DistVincenty(pt1,pt3,&local_68);
  dVar1 = local_68.distance;
  if ((bVar2) && (bVar2 = DistVincenty(pt1,pt2,&local_68), bVar2)) {
    local_48 = local_68.distance;
    local_50 = local_68.azimuth;
    LVar3 = DestVincenty(pt1,local_68.azimuth,dVar1);
    local_40.longitude = LVar3.longitude;
    local_40.latitude = LVar3.latitude;
    bVar2 = DistVincenty(pt3,&local_40,&local_68);
    if (bVar2) {
      if (local_68.distance <= 0.0005) {
        bVar2 = dVar1 - local_48 <= 0.0005 || 0 < lengthCode;
      }
      else if (lengthCode == 2) {
        LVar3 = DestVincenty(pt1,local_50 + 3.141592653589793,dVar1);
        local_40.longitude = LVar3.longitude;
        local_40.latitude = LVar3.latitude;
        bVar2 = DistVincenty(pt3,&local_40,&local_68);
        if (!bVar2) {
          return false;
        }
        bVar2 = local_68.distance <= 0.0005;
      }
      else {
        bVar2 = false;
      }
      result->result = (uint)bVar2;
      dVar1 = pt1->longitude;
      (result->geoStart).latitude = pt1->latitude;
      (result->geoStart).longitude = dVar1;
      dVar1 = pt2->longitude;
      (result->geoEnd).latitude = pt2->latitude;
      (result->geoEnd).longitude = dVar1;
      (result->geoPt).latitude = local_40.latitude;
      (result->geoPt).longitude = local_40.longitude;
      result->lengthCode = lengthCode;
      return true;
    }
  }
  return false;
}

Assistant:

bool PtIsOnGeodesic(const LLPoint &pt1, const LLPoint &pt2, const LLPoint &pt3, int lengthCode,
                        PtIsOnGeodesicResult &result)
    {
        InverseResult invResult;
        if (!DistVincenty(pt1, pt3, invResult))
            return false;

        const double dist13 = invResult.distance;

        if (!DistVincenty(pt1, pt2, invResult))
            return false;

        const double dist12 = invResult.distance;
        const double crs12 = invResult.azimuth;

        LLPoint testPt2 = DestVincenty(pt1, crs12, dist13);

        if (!DistVincenty(pt3, testPt2, invResult))
            return false;

        if (invResult.distance <= kTolPtIsOnGeodesic)
        {
            result.result = lengthCode > 0 || dist13 - dist12 <= kTolPtIsOnGeodesic;
        }
        else if (lengthCode == 2)
        {
            testPt2 = DestVincenty(pt1, crs12 + M_PI, dist13);

            if (!DistVincenty(pt3, testPt2, invResult))
                return false;

            result.result = invResult.distance <= kTolPtIsOnGeodesic;
        }
        else
        {
            result.result = false;
        }
        result.geoStart = pt1;
        result.geoEnd = pt2;
        result.geoPt = testPt2;
        result.lengthCode = lengthCode;
        return true;
    }